

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O3

Vector3d *
sdf::SDFGradient(Vector3d *__return_storage_ptr__,Vector3d *location,
                vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives)

{
  ActualDstType actualDst;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  Vector3d local_d8;
  Vector3d local_b8;
  Vector3d local_98;
  Vector3d local_78;
  Vector3d local_58;
  Vector3d local_38;
  
  local_38.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0] + 1e-05;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1] + 0.0;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2] + 0.0;
  dVar1 = SDF(&local_38,primitives);
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0] + -1e-05;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1] + -0.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  dVar2 = SDF(&local_58,primitives);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0] + 0.0;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1] + 1e-05;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2] + 0.0;
  dVar3 = SDF(&local_78,primitives);
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0] + -0.0;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1] + -1e-05;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  dVar4 = SDF(&local_98,primitives);
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0] + 0.0;
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1] + 0.0;
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2] + 1e-05;
  dVar5 = SDF(&local_b8,primitives);
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1];
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (location->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2] + -1e-05;
  dVar6 = SDF(&local_d8,primitives);
  auVar7._8_8_ = dVar3 - dVar4;
  auVar7._0_8_ = dVar1 - dVar2;
  auVar7 = divpd(auVar7,_DAT_00106210);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
   m_data.array = auVar7;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = (dVar5 - dVar6) / 2e-05;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d 
  SDFGradient(const Eigen::Vector3d &location,  std::vector<Primitive*> &primitives)
  {
    double delta=1e-05;
    return Eigen::Vector3d(
           SDF(location + Eigen::Vector3d(delta,0,0), primitives) - SDF(location - Eigen::Vector3d(delta,0,0), primitives),
           SDF(location + Eigen::Vector3d(0,delta,0), primitives) - SDF(location - Eigen::Vector3d(0,delta,0), primitives),
           SDF(location + Eigen::Vector3d(0,0,delta), primitives) - SDF(location - Eigen::Vector3d(0,0,delta), primitives))/(2.0*delta);
  }